

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::create_directories(path *p,error_code *ec)

{
  const_iterator cVar1;
  const_iterator cVar2;
  byte bVar3;
  int iVar4;
  error_category *peVar5;
  bool bVar6;
  bool bVar7;
  error_code tec;
  string_type part;
  file_status fs;
  path current;
  error_code tmp_ec;
  iterator __begin2;
  iterator __end2;
  path local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  error_category *local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  file_status local_c0;
  error_category *local_b8;
  iterator local_b0;
  iterator local_70;
  
  local_110._0_8_ = &local_100;
  local_110._8_8_ = (error_category *)0x0;
  local_100._M_local_buf[0] = '\0';
  peVar5 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar5;
  local_158._path._M_dataplus._M_p = (p->_path)._M_dataplus._M_p;
  local_138._M_dataplus._M_p = (p->_path)._M_string_length + local_158._path._M_dataplus._M_p;
  local_70._first._M_current = local_158._path._M_dataplus._M_p;
  path::iterator::iterator
            (&local_b0,&local_70._first,(const_iterator *)&local_138,(const_iterator *)&local_158);
  local_138._M_dataplus._M_p = (p->_path)._M_dataplus._M_p;
  local_158._path._M_dataplus._M_p = local_138._M_dataplus._M_p + (p->_path)._M_string_length;
  local_e8._8_8_ = local_158._path._M_dataplus._M_p;
  path::iterator::iterator
            (&local_70,(const_iterator *)&local_138,(const_iterator *)&local_158,
             (const_iterator *)(local_e8 + 8));
  bVar3 = 0;
  local_f0 = peVar5;
  while( true ) {
    cVar2._M_current = local_70._iter._M_current;
    cVar1._M_current = local_b0._iter._M_current;
    if (local_b0._iter._M_current == local_70._iter._M_current) break;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_b0._current._path._M_dataplus._M_p,
               local_b0._current._path._M_dataplus._M_p + local_b0._current._path._M_string_length);
    path::append<std::__cxx11::string>((path *)local_110,&local_138);
    path::root_name(&local_158,p);
    bVar6 = true;
    if (local_110._8_8_ == local_158._path._M_string_length) {
      if ((error_category *)local_110._8_8_ == (error_category *)0x0) {
        bVar6 = false;
      }
      else {
        iVar4 = bcmp((void *)local_110._0_8_,local_158._path._M_dataplus._M_p,local_110._8_8_);
        bVar6 = iVar4 != 0;
      }
    }
    if (bVar6) {
      path::root_path((path *)(local_e8 + 8),p);
      bVar7 = true;
      if (local_110._8_8_ == local_d8._M_allocated_capacity) {
        if ((error_category *)local_110._8_8_ == (error_category *)0x0) goto LAB_00158143;
        iVar4 = bcmp((void *)local_110._0_8_,(void *)local_e8._8_8_,local_110._8_8_);
        bVar7 = iVar4 != 0;
      }
    }
    else {
LAB_00158143:
      bVar7 = false;
    }
    if ((bVar6) && (local_e8._8_8_ != (long)local_d8._M_local_buf + 8)) {
      operator_delete((void *)local_e8._8_8_,local_d8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._path._M_dataplus._M_p != &local_158._path.field_2) {
      operator_delete(local_158._path._M_dataplus._M_p,
                      local_158._path.field_2._M_allocated_capacity + 1);
    }
    peVar5 = local_f0;
    bVar6 = true;
    if (bVar7) {
      local_158._path._M_dataplus._M_p = local_158._path._M_dataplus._M_p & 0xffffffff00000000;
      local_158._path._M_string_length = (size_type)local_f0;
      detail::status_ex((path *)local_118,(error_code *)local_110,(file_status *)&local_158,
                        (uintmax_t *)0x0,(uintmax_t *)0x0,(time_t *)0x0,0);
      if (((file_type)local_158._path._M_dataplus._M_p == none) || (local_118._0_4_ == 1)) {
        if ((uint)local_118._0_4_ < 2) {
          create_directory((path *)local_110,ec);
          if (ec->_M_value != 0) {
            local_c0._type = none;
            local_b8 = peVar5;
            detail::status_ex((path *)local_e8,(error_code *)local_110,&local_c0,(uintmax_t *)0x0,
                              (uintmax_t *)0x0,(time_t *)0x0,0);
            if (local_e8._0_4_ != 3) {
              bVar6 = false;
              goto LAB_0015829d;
            }
            ec->_M_value = 0;
            ec->_M_cat = peVar5;
          }
          bVar6 = true;
          bVar3 = 1;
        }
        else {
          bVar6 = true;
          if (local_118._0_4_ != 3) {
            ec->_M_value = 0x11;
            ec->_M_cat = peVar5;
            goto LAB_001581eb;
          }
        }
      }
      else {
        *(pointer *)ec = local_158._path._M_dataplus._M_p;
        ec->_M_cat = (error_category *)local_158._path._M_string_length;
LAB_001581eb:
        bVar6 = false;
      }
    }
LAB_0015829d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (!bVar6) break;
    path::iterator::operator++(&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
    operator_delete(local_70._current._path._M_dataplus._M_p,
                    local_70._current._path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._current._path._M_dataplus._M_p != &local_b0._current._path.field_2) {
    operator_delete(local_b0._current._path._M_dataplus._M_p,
                    local_b0._current._path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != &local_100) {
    operator_delete((void *)local_110._0_8_,
                    CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1);
  }
  return (bool)(cVar1._M_current == cVar2._M_current & bVar3);
}

Assistant:

GHC_INLINE bool create_directories(const path& p, std::error_code& ec) noexcept
{
    path current;
    ec.clear();
    bool didCreate = false;
    for (path::string_type part : p) {
        current /= part;
        if (current != p.root_name() && current != p.root_path()) {
            std::error_code tec;
            auto fs = status(current, tec);
            if (tec && fs.type() != file_type::not_found) {
                ec = tec;
                return false;
            }
            if (!exists(fs)) {
                create_directory(current, ec);
                if (ec) {
                    std::error_code tmp_ec;
                    if (is_directory(current, tmp_ec)) {
                        ec.clear();
                    } else {
                        return false;
                    }
                }
                didCreate = true;
            }
#ifndef LWG_2935_BEHAVIOUR
            else if (!is_directory(fs)) {
                ec = detail::make_error_code(detail::portable_error::exists);
                return false;
            }
#endif
        }
    }
    return didCreate;
}